

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hostcheck.c
# Opt level: O3

_Bool Curl_cert_hostcheck(char *match,size_t matchlen,char *hostname,size_t hostlen)

{
  _Bool _Var1;
  int iVar2;
  char *second;
  char *pcVar3;
  char *__n;
  char *__n_00;
  
  if (match == (char *)0x0) {
    return false;
  }
  if ((hostname == (char *)0x0 || *match == '\0') || (*hostname == '\0')) {
LAB_0016ae56:
    _Var1 = false;
  }
  else {
    __n_00 = (char *)(hostlen - (hostname[hostlen - 1] == '.'));
    __n = (char *)(matchlen - (match[matchlen - 1] == '.'));
    if ((*match == '*') && (match[1] == '.')) {
      _Var1 = Curl_host_is_ipnum(hostname);
      if (_Var1) goto LAB_0016ae56;
      second = (char *)memchr(match,0x2e,(size_t)__n);
      if ((second == (char *)0x0) ||
         (pcVar3 = (char *)memrchr(match,0x2e,(size_t)__n), pcVar3 == second)) goto LAB_0016ae3c;
      pcVar3 = (char *)memchr(hostname,0x2e,(size_t)__n_00);
      if ((pcVar3 == (char *)0x0) ||
         (__n_00 = hostname + ((long)__n_00 - (long)pcVar3),
         __n_00 != match + ((long)__n - (long)second))) goto LAB_0016ae56;
    }
    else {
LAB_0016ae3c:
      second = match;
      pcVar3 = hostname;
      if (__n_00 != __n) goto LAB_0016ae56;
    }
    iVar2 = curl_strnequal(pcVar3,second,(size_t)__n_00);
    _Var1 = iVar2 != 0;
  }
  return _Var1;
}

Assistant:

bool Curl_cert_hostcheck(const char *match, size_t matchlen,
                         const char *hostname, size_t hostlen)
{
  if(match && *match && hostname && *hostname)
    return hostmatch(hostname, hostlen, match, matchlen);
  return FALSE;
}